

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O2

bool miniros::service::waitForService(string *service_name,Duration *timeout)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint __seconds;
  WallDuration *pWVar4;
  DurationBase<miniros::WallDuration> *pDVar5;
  WallTime start_time;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_80;
  WallDuration wall_timeout;
  WallTime current_time;
  string mapped_name;
  
  names::resolve(&mapped_name,service_name,true);
  WallTime::now();
  WallDuration::WallDuration
            (&wall_timeout,
             (double)(timeout->super_DurationBase<miniros::Duration>).nsec * 1e-09 +
             (double)(timeout->super_DurationBase<miniros::Duration>).sec);
  bVar3 = false;
  while( true ) {
    bVar1 = ok();
    if (!bVar1) break;
    bVar2 = exists(service_name,(bool)~bVar3);
    if (bVar2) break;
    WallDuration::WallDuration((WallDuration *)&current_time,0.0);
    pWVar4 = (WallDuration *)&current_time;
    bVar3 = DurationBase<miniros::WallDuration>::operator>=
                      (&wall_timeout.super_DurationBase<miniros::WallDuration>,
                       (WallDuration *)&current_time);
    __seconds = (uint)pWVar4;
    if (bVar3) {
      current_time = WallTime::now();
      TimeBase<miniros::WallTime,_miniros::WallDuration>::operator-(&local_80,&current_time);
      pDVar5 = &wall_timeout.super_DurationBase<miniros::WallDuration>;
      bVar3 = DurationBase<miniros::WallDuration>::operator>=
                        ((DurationBase<miniros::WallDuration> *)&local_80,
                         (WallDuration *)&wall_timeout.super_DurationBase<miniros::WallDuration>);
      __seconds = (uint)pDVar5;
      if (bVar3) {
        bVar1 = false;
        goto LAB_0024335d;
      }
    }
    WallDuration::WallDuration((WallDuration *)&current_time,0.02);
    WallDuration::sleep((WallDuration *)&current_time,__seconds);
    bVar3 = true;
  }
  if (bVar3) {
    bVar3 = ok();
    if (bVar3) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (waitForService::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&current_time,"miniros.unknown_package",(allocator<char> *)&local_80);
        console::initializeLogLocation(&waitForService::loc,(string *)&current_time,Info);
        std::__cxx11::string::~string((string *)&current_time);
      }
      if (waitForService::loc.level_ != Info) {
        console::setLogLocationLevel(&waitForService::loc,Info);
        console::checkLogLocationEnabled(&waitForService::loc);
      }
      if (waitForService::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,waitForService::loc.logger_,waitForService::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                       ,0x7b,
                       "bool miniros::service::waitForService(const std::string &, miniros::Duration)"
                       ,"waitForService: Service [%s] is now available.",
                       mapped_name._M_dataplus._M_p);
      }
    }
  }
LAB_0024335d:
  std::__cxx11::string::~string((string *)&mapped_name);
  return bVar1;
}

Assistant:

bool service::waitForService(const std::string& service_name, miniros::Duration timeout)
{
  std::string mapped_name = names::resolve(service_name);

  const WallTime start_time = WallTime::now();
  const WallDuration wall_timeout{timeout.toSec()};

  bool printed = false;
  bool result = false;
  while (miniros::ok())
  {
    if (exists(service_name, !printed))
    {
      result = true;
      break;
    }
    else
    {
      printed = true;

      if (wall_timeout >= WallDuration(0))
      {
        const WallTime current_time = WallTime::now();

        if ((current_time - start_time) >= wall_timeout)
        {
          return false;
        }
      }

      WallDuration(0.02).sleep();
    }
  }

  if (printed && miniros::ok())
  {
    MINIROS_INFO("waitForService: Service [%s] is now available.", mapped_name.c_str());
  }

  return result;
}